

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

void __thiscall
BitStreamWriter<VectorWriter>::Write(BitStreamWriter<VectorWriter> *this,uint64_t data,int nbits)

{
  int iVar1;
  long lVar2;
  int iVar3;
  out_of_range *this_00;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)nbits < 0x41) {
    if (nbits != 0) {
      do {
        iVar1 = this->m_offset;
        iVar3 = 8 - iVar1;
        if (nbits < 8 - iVar1) {
          iVar3 = nbits;
        }
        this->m_buffer =
             this->m_buffer |
             (byte)((data << (-(char)nbits & 0x3fU)) >> ((char)iVar1 + 0x38U & 0x3f));
        this->m_offset = iVar1 + iVar3;
        if (iVar1 + iVar3 == 8) {
          Flush(this);
        }
        nbits = nbits - iVar3;
      } while (0 < nbits);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  else {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"nbits must be between 0 and 64");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Write(uint64_t data, int nbits) {
        if (nbits < 0 || nbits > 64) {
            throw std::out_of_range("nbits must be between 0 and 64");
        }

        while (nbits > 0) {
            int bits = std::min(8 - m_offset, nbits);
            m_buffer |= (data << (64 - nbits)) >> (64 - 8 + m_offset);
            m_offset += bits;
            nbits -= bits;

            if (m_offset == 8) {
                Flush();
            }
        }
    }